

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O0

REF_STATUS ref_update_agent_tri_seed(REF_INTERP ref_interp,REF_INT id,REF_INT node0,REF_INT node1)

{
  REF_NODE pRVar1;
  int iVar2;
  REF_GLOB local_60;
  int local_50;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT node;
  REF_INT cells [2];
  REF_INT ncell;
  REF_AGENTS ref_agents;
  REF_CELL tris;
  REF_NODE ref_node;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_INT id_local;
  REF_INTERP ref_interp_local;
  
  pRVar1 = ref_interp->from_grid->node;
  unique0x00012000 = ref_interp->ref_agents;
  ref_interp_local._4_4_ =
       ref_cell_list_with2(ref_interp->from_tri,node0,node1,2,cells,&ref_private_macro_code_rss);
  if (ref_interp_local._4_4_ == 0) {
    if (cells[0] == 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0x233,"ref_update_agent_tri_seed","bary update missing first");
      ref_interp_local._4_4_ = 1;
    }
    else if (cells[0] == 1) {
      if ((pRVar1->ref_mpi->id == pRVar1->part[node0]) ||
         (pRVar1->ref_mpi->id == pRVar1->part[node1])) {
        stack0xffffffffffffffc0->agent[id].mode = REF_AGENT_AT_BOUNDARY;
        ref_interp_local._4_4_ = 0;
      }
      else {
        iVar2 = rand();
        local_50 = node0;
        if (iVar2 % 2 == 1) {
          local_50 = node1;
        }
        stack0xffffffffffffffc0->agent[id].part = pRVar1->part[local_50];
        stack0xffffffffffffffc0->agent[id].seed = -1;
        if (((local_50 < 0) || (pRVar1->max <= local_50)) || (pRVar1->global[local_50] < 0)) {
          local_60 = -1;
        }
        else {
          local_60 = pRVar1->global[local_50];
        }
        stack0xffffffffffffffc0->agent[id].global = local_60;
        stack0xffffffffffffffc0->agent[id].mode = REF_AGENT_HOP_PART;
        ref_interp_local._4_4_ = 0;
      }
    }
    else if (stack0xffffffffffffffc0->agent[id].seed == ref_private_macro_code_rss) {
      stack0xffffffffffffffc0->agent[id].seed = node;
      ref_interp_local._4_4_ = 0;
    }
    else if (stack0xffffffffffffffc0->agent[id].seed == node) {
      stack0xffffffffffffffc0->agent[id].seed = ref_private_macro_code_rss;
      ref_interp_local._4_4_ = 0;
    }
    else {
      ref_interp_local._4_4_ = 5;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x232,
           "ref_update_agent_tri_seed",(ulong)ref_interp_local._4_4_,"more then two");
  }
  return ref_interp_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_update_agent_tri_seed(REF_INTERP ref_interp,
                                                    REF_INT id, REF_INT node0,
                                                    REF_INT node1) {
  REF_NODE ref_node = ref_grid_node(ref_interp_from_grid(ref_interp));
  REF_CELL tris = ref_interp_from_tri(ref_interp);
  REF_AGENTS ref_agents = ref_interp->ref_agents;
  REF_INT ncell, cells[2];
  REF_INT node;

  RSS(ref_cell_list_with2(tris, node0, node1, 2, &ncell, cells),
      "more then two");
  if (0 == ncell) THROW("bary update missing first");
  if (1 == ncell) {
    /* if it is off proc */
    if (!ref_node_owned(ref_node, node0) && !ref_node_owned(ref_node, node1)) {
      /* pick at pseudo random */
      node = node0;
      if (1 == rand() % 2) node = node1;
      ref_agent_part(ref_agents, id) = ref_node_part(ref_node, node);
      ref_agent_seed(ref_agents, id) = REF_EMPTY;
      ref_agent_global(ref_agents, id) = ref_node_global(ref_node, node);
      ref_agent_mode(ref_agents, id) = REF_AGENT_HOP_PART;
      return REF_SUCCESS;
    }
    /* hit boundary, skip verify for no geom */
    ref_agent_mode(ref_agents, id) = REF_AGENT_AT_BOUNDARY;
    return REF_SUCCESS;
  }

  if (ref_agent_seed(ref_agents, id) == cells[0]) {
    ref_agent_seed(ref_agents, id) = cells[1];
    return REF_SUCCESS;
  }
  if (ref_agent_seed(ref_agents, id) == cells[1]) {
    ref_agent_seed(ref_agents, id) = cells[0];
    return REF_SUCCESS;
  }

  return REF_NOT_FOUND;
}